

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_walker.c
# Opt level: O3

FunctionExpression * raviX_upvalue_target_function(LuaUpvalueSymbol *symbol)

{
  AstNode *pAVar1;
  FunctionExpression *pFVar2;
  
  pAVar1 = symbol->target_variable_function;
  if (symbol->target_variable->symbol_type == SYM_ENV) {
    if (pAVar1 != (AstNode *)0x0) {
      __assert_fail("symbol->target_variable_function == NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/ast_walker.c"
                    ,0x2bf,
                    "const FunctionExpression *raviX_upvalue_target_function(const LuaUpvalueSymbol *)"
                   );
    }
    pFVar2 = (FunctionExpression *)0x0;
  }
  else {
    if (pAVar1->type != EXPR_FUNCTION) {
      __assert_fail("symbol->target_variable_function->type == EXPR_FUNCTION",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/ast_walker.c"
                    ,0x2c2,
                    "const FunctionExpression *raviX_upvalue_target_function(const LuaUpvalueSymbol *)"
                   );
    }
    pFVar2 = (FunctionExpression *)&pAVar1->field_2;
  }
  return pFVar2;
}

Assistant:

const FunctionExpression *raviX_upvalue_target_function(const LuaUpvalueSymbol *symbol)
{
	if (symbol->target_variable->symbol_type == SYM_ENV) {
		assert(symbol->target_variable_function == NULL);
		return NULL;
	}
	assert(symbol->target_variable_function->type == EXPR_FUNCTION);
	return &symbol->target_variable_function->function_expr;
}